

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O2

void __thiscall CLIListener::do_fetch(CLIListener *this,Poll *p,string *arg)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint64_t cmd_seq;
  undefined8 this_01;
  iterator iVar1;
  mapped_type *pmVar2;
  ostream *poVar3;
  char *pcVar4;
  shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> query;
  mapped_type addr;
  Simple dto;
  undefined1 local_140 [16];
  __shared_ptr<Subscriber,(__gnu_cxx::_Lock_policy)2> local_130 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  OnResponse local_100;
  string local_e0;
  code *local_c0 [2];
  code *local_b0;
  code *local_a8;
  undefined1 local_a0 [56];
  undefined1 local_68 [24];
  string local_50 [32];
  _Head_base<1UL,_std::reference_wrapper<Poll>,_false> local_30;
  _Head_base<0UL,_CLIListener_*,_false> local_28;
  
  this_00 = &this->file_server;
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,arg);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    poVar3 = (ostream *)&std::cout;
    pcVar4 = "Could not find a server to fetch from, execute search first";
  }
  else {
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,arg);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,arg);
      std::__cxx11::string::string((string *)&local_120,(string *)pmVar2);
      cmd_seq = this->cmd_seq;
      this->cmd_seq = cmd_seq + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"GET",(allocator<char> *)local_68);
      ::dto::create((Simple *)local_a0,cmd_seq,&local_e0,arg);
      std::__cxx11::string::~string((string *)&local_e0);
      std::
      make_shared<MultiQuery<dto::Simple,dto::Complex>,dto::Simple&,unsigned_short&,std::__cxx11::string&,int_const&>
                ((Simple *)local_140,(unsigned_short *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->port,
                 (int *)&local_120);
      std::__shared_ptr<Subscriber,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<MultiQuery<dto::Simple,dto::Complex>,void>
                (local_130,
                 (__shared_ptr<MultiQuery<dto::Simple,_dto::Complex>,_(__gnu_cxx::_Lock_policy)2> *)
                 local_140);
      Poll::subscribe(p,(shared_ptr<Subscriber> *)local_130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
      this_01 = local_140._0_8_;
      local_68._0_8_ = on_fetch_result;
      local_68._8_8_ = 0;
      std::_Tuple_impl<4ul,std::__cxx11::string,unsigned_short>::
      _Tuple_impl<std::__cxx11::string&,unsigned_short&,void>
                ((_Tuple_impl<4ul,std::__cxx11::string,unsigned_short> *)(local_68 + 0x10),
                 &local_120,&this->port);
      local_30._M_head_impl._M_data = (reference_wrapper<Poll>)(reference_wrapper<Poll>)p;
      local_28._M_head_impl = this;
      std::function<void(dto::Complex&,sockaddr_in)>::
      function<std::_Bind<void(CLIListener::*(CLIListener*,std::reference_wrapper<Poll>,std::_Placeholder<1>,std::_Placeholder<2>,std::__cxx11::string,unsigned_short))(Poll&,dto::Complex&,sockaddr_in,std::__cxx11::string,unsigned_short)>,void>
                ((function<void(dto::Complex&,sockaddr_in)> *)&local_100,
                 (_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short))(Poll_&,_dto::Complex_&,_sockaddr_in,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short)>
                  *)local_68);
      MultiQuery<dto::Simple,_dto::Complex>::when_response
                ((MultiQuery<dto::Simple,_dto::Complex> *)this_01,&local_100);
      std::_Function_base::~_Function_base(&local_100.super__Function_base);
      std::__cxx11::string::~string(local_50);
      local_c0[1] = (code *)0x0;
      local_c0[0] = request_failed;
      local_a8 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
      local_b0 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
      MultiQuery<dto::Simple,_dto::Complex>::when_error
                ((MultiQuery<dto::Simple,_dto::Complex> *)local_140._0_8_,(OnError *)local_c0);
      std::_Function_base::~_Function_base((_Function_base *)local_c0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_140 + 8));
      std::__cxx11::string::~string((string *)(local_a0 + 0x18));
      std::__cxx11::string::~string((string *)&local_120);
      return;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Not found file ");
    poVar3 = std::operator<<(poVar3,(string *)arg);
    pcVar4 = " in search results";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void CLIListener::do_fetch(Poll &p, std::string &arg) {
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Could not find a server to fetch from, execute search first" << std::endl;
    return;
  }
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Not found file " << arg << " in search results" << std::endl;
    return;
  }
  auto addr = file_server[arg];
  auto dto = dto::create(cmd_seq++, "GET", arg);
  auto query = std::make_shared<MultiQuery<dto::Simple, dto::Complex>>(dto, port, addr, LONG_TIMEOUT_MILLIS);
  p.subscribe(query);
  query->when_response(std::bind(&CLIListener::on_fetch_result, this, std::ref(p), _1, _2, addr, port));
  query->when_error(request_failed);
}